

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cpp
# Opt level: O1

void duckdb_brotli::DecodeLiteralBlockSwitch(BrotliDecoderStateInternal *s)

{
  uint64_t *puVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  ulong uVar5;
  long *plVar6;
  uint *puVar7;
  HuffmanCode **ppHVar8;
  HuffmanCode *pHVar9;
  ulong uVar10;
  HuffmanCode *pHVar11;
  uint64_t uVar12;
  ulong uVar13;
  
  uVar5 = s->num_block_types[0];
  if (1 < uVar5) {
    pHVar11 = s->block_type_trees;
    uVar10 = (s->br).bit_pos_;
    if (uVar10 < 0x11) {
      plVar6 = (long *)(s->br).next_in;
      (s->br).val_ = (s->br).val_ | *plVar6 << ((byte)uVar10 & 0x3f);
      (s->br).bit_pos_ = uVar10 + 0x30;
      (s->br).next_in = (uint8_t *)((long)plVar6 + 6);
    }
    uVar10 = (s->br).val_;
    pHVar11 = pHVar11 + (uVar10 & 0xff);
    bVar2 = pHVar11->bits;
    if (8 < bVar2) {
      puVar1 = &(s->br).bit_pos_;
      *puVar1 = *puVar1 - 8;
      uVar10 = uVar10 >> 8;
      (s->br).val_ = uVar10;
      pHVar11 = pHVar11 + (uVar10 & *(ulong *)(kBrotliBitMask + (ulong)(bVar2 - 8) * 8)) +
                          (ulong)pHVar11->value;
    }
    pHVar9 = s->block_len_trees;
    uVar10 = (s->br).bit_pos_ - (ulong)pHVar11->bits;
    uVar13 = (s->br).val_ >> (pHVar11->bits & 0x3f);
    (s->br).bit_pos_ = uVar10;
    (s->br).val_ = uVar13;
    uVar3 = pHVar11->value;
    if (uVar10 < 0x11) {
      plVar6 = (long *)(s->br).next_in;
      (s->br).val_ = *plVar6 << ((byte)uVar10 & 0x3f) | uVar13;
      (s->br).bit_pos_ = uVar10 + 0x30;
      (s->br).next_in = (uint8_t *)((long)plVar6 + 6);
    }
    uVar10 = (s->br).val_;
    pHVar9 = pHVar9 + (uVar10 & 0xff);
    bVar2 = pHVar9->bits;
    if (8 < bVar2) {
      puVar1 = &(s->br).bit_pos_;
      *puVar1 = *puVar1 - 8;
      uVar10 = uVar10 >> 8;
      (s->br).val_ = uVar10;
      pHVar9 = pHVar9 + (uVar10 & *(ulong *)(kBrotliBitMask + (ulong)(bVar2 - 8) * 8)) +
                        (ulong)pHVar9->value;
    }
    uVar13 = (s->br).val_ >> (pHVar9->bits & 0x3f);
    uVar10 = (s->br).bit_pos_ - (ulong)pHVar9->bits;
    (s->br).bit_pos_ = uVar10;
    (s->br).val_ = uVar13;
    bVar2 = _kBrotliPrefixCodeRanges[(ulong)pHVar9->value * 4 + 2];
    uVar4 = *(ushort *)(_kBrotliPrefixCodeRanges + (ulong)pHVar9->value * 4);
    if (uVar10 < 0x21) {
      puVar7 = (uint *)(s->br).next_in;
      (s->br).val_ = (ulong)*puVar7 << ((byte)uVar10 & 0x3f) | uVar13;
      (s->br).bit_pos_ = uVar10 + 0x20;
      (s->br).next_in = (uint8_t *)(puVar7 + 1);
    }
    uVar10 = (s->br).val_;
    uVar13 = *(ulong *)(kBrotliBitMask + (ulong)bVar2 * 8);
    puVar1 = &(s->br).bit_pos_;
    *puVar1 = *puVar1 - (ulong)bVar2;
    (s->br).val_ = uVar10 >> (bVar2 & 0x3f);
    s->block_length[0] = (uVar13 & uVar10) + (ulong)uVar4;
    if ((ulong)uVar3 == 0) {
      uVar12 = s->block_type_rb[0];
    }
    else if (uVar3 == 1) {
      uVar12 = s->block_type_rb[1] + 1;
    }
    else {
      uVar12 = (ulong)uVar3 - 2;
    }
    uVar10 = 0;
    if (uVar5 <= uVar12) {
      uVar10 = uVar5;
    }
    s->block_type_rb[0] = s->block_type_rb[1];
    s->block_type_rb[1] = uVar12 - uVar10;
    if (1 < uVar5) {
      ppHVar8 = (s->literal_hgroup).htrees;
      uVar5 = s->block_type_rb[1];
      s->context_map_slice = s->context_map + uVar5 * 0x40;
      s->trivial_literal_context =
           (uint)((s->trivial_literal_contexts[uVar5 >> 5] >> ((uint)uVar5 & 0x1f) & 1) != 0);
      s->literal_htree = ppHVar8[s->context_map[uVar5 * 0x40]];
      s->context_lookup = &_kBrotliContextLookupTable + ((s->context_modes[uVar5] & 3) << 9);
    }
  }
  return;
}

Assistant:

static BROTLI_INLINE BROTLI_BOOL DecodeBlockTypeAndLength(int safe, BrotliDecoderState *s, int tree_type) {
	brotli_reg_t max_block_type = s->num_block_types[tree_type];
	const HuffmanCode *type_tree = &s->block_type_trees[tree_type * BROTLI_HUFFMAN_MAX_SIZE_258];
	const HuffmanCode *len_tree = &s->block_len_trees[tree_type * BROTLI_HUFFMAN_MAX_SIZE_26];
	BrotliBitReader *br = &s->br;
	brotli_reg_t *ringbuffer = &s->block_type_rb[tree_type * 2];
	brotli_reg_t block_type;
	if (max_block_type <= 1) {
		return BROTLI_FALSE;
	}

	/* Read 0..15 + 3..39 bits. */
	if (!safe) {
		block_type = ReadSymbol(type_tree, br);
		s->block_length[tree_type] = ReadBlockLength(len_tree, br);
	} else {
		BrotliBitReaderState memento;
		BrotliBitReaderSaveState(br, &memento);
		if (!SafeReadSymbol(type_tree, br, &block_type))
			return BROTLI_FALSE;
		if (!SafeReadBlockLength(s, &s->block_length[tree_type], len_tree, br)) {
			s->substate_read_block_length = BROTLI_STATE_READ_BLOCK_LENGTH_NONE;
			BrotliBitReaderRestoreState(br, &memento);
			return BROTLI_FALSE;
		}
	}

	if (block_type == 1) {
		block_type = ringbuffer[1] + 1;
	} else if (block_type == 0) {
		block_type = ringbuffer[0];
	} else {
		block_type -= 2;
	}
	if (block_type >= max_block_type) {
		block_type -= max_block_type;
	}
	ringbuffer[0] = ringbuffer[1];
	ringbuffer[1] = block_type;
	return BROTLI_TRUE;
}